

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

bool __thiscall
ChebTools::ChebyshevExpansion::has_real_roots_Descartes(ChebyshevExpansion *this,double reltol)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ArrayXd a_1;
  ArrayXd coeff_shift_xmax;
  ArrayXd coeff_shift_xmin;
  ArrayXd coefderiv_mono;
  DenseStorage<double,__1,__1,_1,_0> local_80;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  double local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  ChebyshevExpansion *local_48;
  ArrayXd local_40;
  undefined1 local_30 [16];
  ChebyshevExpansion *local_20;
  
  local_60 = reltol;
  to_monomial_increasing((ChebyshevExpansion *)local_30);
  local_48 = (ChebyshevExpansion *)local_30;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_80,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_48);
  uVar6 = (uint)local_80.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_70,&local_80);
  if (0 < (int)(uVar6 - 1)) {
    lVar8 = 0;
    if (0 < local_70.m_rows) {
      lVar8 = local_70.m_rows;
    }
    lVar1 = 1;
    if (1 < local_70.m_rows) {
      lVar1 = local_70.m_rows;
    }
    uVar4 = 1;
    uVar5 = uVar6;
    do {
      if (0 < (int)(uVar6 - uVar4)) {
        lVar7 = 0;
        do {
          if ((lVar8 == lVar7) || (lVar1 + -1 == lVar7)) goto LAB_001058b1;
          local_70.m_data[lVar7 + 1] = local_70.m_data[lVar7 + 1] - local_70.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while ((ulong)uVar5 - 1 != lVar7);
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar4 != uVar6);
  }
  local_58.m_data = (double *)&local_70;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_40,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_58);
  free(local_70.m_data);
  free(local_80.m_data);
  local_20 = (ChebyshevExpansion *)local_30;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_58,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_20);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_80,&local_58);
  if (0 < (int)((uint)local_58.m_rows - 1)) {
    lVar8 = CONCAT44(local_80.m_rows._4_4_,(uint)local_80.m_rows);
    lVar1 = 0;
    if (0 < lVar8) {
      lVar1 = lVar8;
    }
    lVar7 = 1;
    if (1 < lVar8) {
      lVar7 = lVar8;
    }
    uVar5 = 1;
    uVar6 = (uint)local_58.m_rows;
    do {
      if (0 < (int)((uint)local_58.m_rows - uVar5)) {
        lVar8 = 0;
        do {
          if ((lVar1 == lVar8) || (lVar7 + -1 == lVar8)) {
LAB_001058b1:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                         );
          }
          local_80.m_data[lVar8 + 1] = local_80.m_data[lVar8] + local_80.m_data[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar6 - 1 != lVar8);
      }
      uVar5 = uVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar5 != (uint)local_58.m_rows);
  }
  local_48 = (ChebyshevExpansion *)&local_80;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_70,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_48);
  free(local_80.m_data);
  free(local_58.m_data);
  sVar2 = count_sign_changes(&local_40,local_60);
  sVar3 = count_sign_changes((ArrayXd *)&local_70,local_60);
  free(local_70.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((void *)local_30._0_8_);
  return (int)sVar3 != (int)sVar2;
}

Assistant:

bool ChebyshevExpansion::has_real_roots_Descartes(const double reltol) const {
        
        // Turn derivative expansion into polynomial
        // as monomial-basis in increasing order
        auto coefderiv_mono = to_monomial_increasing();
    
        // Optimized Polynomial Taylor shift using the Horner method
        // See: http://www.hvks.com/Numerical/Downloads/HVE%20Polynomial%20Taylor%20shifting.pdf
        auto shift_poly_Horner = [](const Eigen::ArrayXd& a_decreasing, double shift){
            int n = a_decreasing.size()-1;
            Eigen::ArrayXd a = a_decreasing;
            if (shift == 0) return a; // No shift, no change
            for (int j = 1; j <= n; ++j){
                for (int i = 1; i <= n - j + 1; ++i){
                    a[i] += shift*a[i - 1];
                }
            }
            return a;
        };
        
        Eigen::ArrayXd coeff_shift_xmin = shift_poly_Horner(coefderiv_mono.reverse(), -1).reverse();
        Eigen::ArrayXd coeff_shift_xmax = shift_poly_Horner(coefderiv_mono.reverse(), 1).reverse();
//        std::cout << coeff_shift_xmin << std::endl;
//        std::cout << coeff_shift_xmax << std::endl;
        int N_changes_xmin = count_sign_changes(coeff_shift_xmin, reltol); // Number of roots in [-1, inf)
        int N_changes_xmax = count_sign_changes(coeff_shift_xmax, reltol); // Number of roots in [1, inf)
        
        // Difference between these two are the number of roots inside [-1,1]
        int N_changes_n11 = N_changes_xmax - N_changes_xmin;
        
        // If the same, there are no additional extrema in [-1, 1], and the function is monotonic
        return (N_changes_n11 != 0);
    }